

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

__pid_t __thiscall cs::process_context::fork(process_context *this)

{
  undefined8 uVar1;
  undefined *puVar2;
  __uniq_ptr_data<cs::process_context,_std::default_delete<cs::process_context>,_true,_true> this_00
  ;
  size_t ss;
  unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> new_process;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00.super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t
  .super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
  super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>)
       operator_new(0x110);
  ss = 100;
  if (999 < *(ulong *)(current_process + 0x78)) {
    ss = *(ulong *)(current_process + 0x78) / 10;
  }
  process_context((process_context *)
                  this_00.
                  super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>
                  .super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl,ss);
  *(int *)((long)this_00.
                 super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>
                 .super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0x50) =
       *(int *)(current_process + 0x50);
  new_process._M_t.
  super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t.
  super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
  super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<cs::process_context,_std::default_delete<cs::process_context>,_true,_true>)
       (__uniq_ptr_data<cs::process_context,_std::default_delete<cs::process_context>,_true,_true>)
       this_00.super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
       ._M_t.
       super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
       super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl;
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)this_00.
                    super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>
                    .super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0x58));
  puVar2 = current_process;
  local_40._8_8_ = 0;
  local_40._M_unused._M_function_pointer = (_func_void *)current_process;
  local_28 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:165:45)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:165:45)>
             ::_M_manager;
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)
             ((long)this_00.
                    super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>
                    .super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0xa8),
             (function<bool_(void_*)> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_60._8_8_ = 0;
  local_60._M_unused._M_function_pointer = (_func_void *)puVar2;
  local_48 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:168:47)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:168:47)>
             ::_M_manager;
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)
             ((long)new_process._M_t.
                    super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>
                    .super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0xd0),
             (function<bool_(void_*)> *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  uVar1 = *(undefined8 *)(current_process + 0x100);
  *(undefined8 *)
   ((long)new_process._M_t.
          super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t
          .super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
          super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0xf8) =
       *(undefined8 *)(current_process + 0xf8);
  *(undefined8 *)
   ((long)new_process._M_t.
          super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t
          .super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
          super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl + 0x100) = uVar1;
  *(__uniq_ptr_data<cs::process_context,_std::default_delete<cs::process_context>,_true,_true> *)
   this = new_process._M_t.
          super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t
          .super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
          super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl;
  new_process._M_t.
  super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t.
  super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
  super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<cs::process_context,_std::default_delete<cs::process_context>,_true,_true>)
       (__uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>)0x0;
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::~unique_ptr
            (&new_process);
  return (__pid_t)this;
}

Assistant:

std::unique_ptr<process_context> process_context::fork()
	{
		std::unique_ptr<process_context> new_process(new process_context(current_process->child_stack_size()));
		new_process->output_precision = current_process->output_precision;
		new_process->import_path = current_process->import_path;
		process_context *curr = current_process;
		new_process->on_process_exit.add_listener([curr](void *data) -> bool {
			return curr->on_process_exit.touch(data);
		});
		new_process->on_process_sigint.add_listener([curr](void *data) -> bool {
			return curr->on_process_sigint.touch(data);
		});
		new_process->std_eh_callback = current_process->std_eh_callback;
		new_process->cs_eh_callback = current_process->cs_eh_callback;
		return std::move(new_process);
	}